

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.hpp
# Opt level: O0

mutable_buffers_1 asio::buffer(mutable_buffer *b,size_t max_size_in_bytes)

{
  void *data;
  size_t sVar1;
  ulong in_RSI;
  mutable_buffer *in_RDI;
  size_t local_40;
  mutable_buffer local_30;
  ulong local_20;
  mutable_buffer *local_18;
  mutable_buffer local_10;
  
  local_20 = in_RSI;
  local_18 = in_RDI;
  data = mutable_buffer::data(in_RDI);
  sVar1 = mutable_buffer::size(local_18);
  if (sVar1 < local_20) {
    local_40 = mutable_buffer::size(local_18);
  }
  else {
    local_40 = local_20;
  }
  mutable_buffer::mutable_buffer(&local_30,data,local_40);
  mutable_buffers_1::mutable_buffers_1((mutable_buffers_1 *)&local_10,&local_30);
  return (mutable_buffers_1)local_10;
}

Assistant:

ASIO_NODISCARD inline ASIO_MUTABLE_BUFFER buffer(
    const mutable_buffer& b,
    std::size_t max_size_in_bytes) ASIO_NOEXCEPT
{
  return ASIO_MUTABLE_BUFFER(
      mutable_buffer(b.data(),
        b.size() < max_size_in_bytes
        ? b.size() : max_size_in_bytes
#if defined(ASIO_ENABLE_BUFFER_DEBUGGING)
        , b.get_debug_check()
#endif // ASIO_ENABLE_BUFFER_DEBUGGING
        ));
}